

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlAutomataStatePtr
xmlAutomataNewCountTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,int min,
          int max,void *data)

{
  int counter_00;
  xmlRegAtomPtr atom_00;
  xmlChar *pxVar1;
  int counter;
  xmlRegAtomPtr atom;
  int max_local;
  int min_local;
  xmlChar *token_local;
  xmlAutomataStatePtr to_local;
  xmlAutomataStatePtr from_local;
  xmlAutomataPtr am_local;
  
  if (((am == (xmlAutomataPtr)0x0) || (from == (xmlAutomataStatePtr)0x0)) ||
     (token == (xmlChar *)0x0)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else if (min < 0) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else if ((max < min) || (max < 1)) {
    am_local = (xmlAutomataPtr)0x0;
  }
  else {
    atom_00 = xmlRegNewAtom(am,XML_REGEXP_STRING);
    if (atom_00 == (xmlRegAtomPtr)0x0) {
      am_local = (xmlAutomataPtr)0x0;
    }
    else {
      pxVar1 = xmlStrdup(token);
      atom_00->valuep = pxVar1;
      atom_00->data = data;
      if (min == 0) {
        atom_00->min = 1;
      }
      else {
        atom_00->min = min;
      }
      atom_00->max = max;
      counter_00 = xmlRegGetCounter(am);
      am->counters[counter_00].min = min;
      am->counters[counter_00].max = max;
      token_local = (xmlChar *)to;
      if (to == (xmlAutomataStatePtr)0x0) {
        token_local = (xmlChar *)xmlRegNewState(am);
        xmlRegStatePush(am,(xmlRegStatePtr)token_local);
      }
      xmlRegStateAddTrans(am,from,atom_00,(xmlRegStatePtr)token_local,counter_00,-1);
      xmlRegAtomPush(am,atom_00);
      am->state = (xmlRegStatePtr)token_local;
      if (token_local == (xmlChar *)0x0) {
        token_local = (xmlChar *)am->state;
      }
      if (token_local == (xmlChar *)0x0) {
        am_local = (xmlAutomataPtr)0x0;
      }
      else {
        if (min == 0) {
          xmlFAGenerateEpsilonTransition(am,from,(xmlRegStatePtr)token_local);
        }
        am_local = (xmlAutomataPtr)token_local;
      }
    }
  }
  return (xmlAutomataStatePtr)am_local;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewCountTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 0)
	return(NULL);
    if ((max < min) || (max < 1))
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->valuep = xmlStrdup(token);
    atom->data = data;
    if (min == 0)
	atom->min = 1;
    else
	atom->min = min;
    atom->max = max;

    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    am->counters[counter].min = min;
    am->counters[counter].max = max;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
        to = xmlRegNewState(am);
	xmlRegStatePush(am, to);
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    xmlRegAtomPush(am, atom);
    am->state = to;

    if (to == NULL)
	to = am->state;
    if (to == NULL)
	return(NULL);
    if (min == 0)
	xmlFAGenerateEpsilonTransition(am, from, to);
    return(to);
}